

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O1

void __thiscall
CoreML::TreeEnsembleClassifier::TreeEnsembleClassifier
          (TreeEnsembleClassifier *this,string *predictedClassOutputName,
          string *classProbabilityOutputName,string *description)

{
  Model *this_00;
  ulong uVar1;
  element_type *peVar2;
  TreeEnsembleClassifier *pTVar3;
  ModelDescription *pMVar4;
  undefined8 *puVar5;
  Arena *pAVar6;
  Model MStack_38;
  
  Model::Model(&MStack_38,description);
  TreeEnsembleBase::TreeEnsembleBase(&this->super_TreeEnsembleBase,&MStack_38,true);
  Model::~Model(&MStack_38);
  (this->super_TreeEnsembleBase).super_Model._vptr_Model =
       (_func_int **)&PTR__TreeEnsembleRegressor_004bccb8;
  this_00 = (this->super_TreeEnsembleBase).super_Model.m_spec.
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00->_oneof_case_[0] != 0x192) {
    Specification::Model::clear_Type(this_00);
    this_00->_oneof_case_[0] = 0x192;
    uVar1 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
    pAVar6 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar6 = *(Arena **)pAVar6;
    }
    pTVar3 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::TreeEnsembleClassifier>(pAVar6);
    (this_00->Type_).treeensembleclassifier_ = pTVar3;
  }
  this->tree_classifier_parameters = (TreeEnsembleClassifier *)this_00->Type_;
  peVar2 = (this->super_TreeEnsembleBase).super_Model.m_spec.
           super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2->description_ == (ModelDescription *)0x0) {
    uVar1 = (peVar2->super_MessageLite)._internal_metadata_.ptr_;
    pAVar6 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar6 = *(Arena **)pAVar6;
    }
    pMVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar6);
    peVar2->description_ = pMVar4;
  }
  uVar1 = (peVar2->description_->super_MessageLite)._internal_metadata_.ptr_;
  puVar5 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar5 = (undefined8 *)*puVar5;
  }
  google::protobuf::internal::ArenaStringPtr::Set
            (&peVar2->description_->predictedfeaturename_,predictedClassOutputName,puVar5);
  peVar2 = (this->super_TreeEnsembleBase).super_Model.m_spec.
           super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2->description_ == (ModelDescription *)0x0) {
    uVar1 = (peVar2->super_MessageLite)._internal_metadata_.ptr_;
    pAVar6 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar6 = *(Arena **)pAVar6;
    }
    pMVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar6);
    peVar2->description_ = pMVar4;
  }
  uVar1 = (peVar2->description_->super_MessageLite)._internal_metadata_.ptr_;
  puVar5 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar5 = (undefined8 *)*puVar5;
  }
  google::protobuf::internal::ArenaStringPtr::Set
            (&peVar2->description_->predictedprobabilitiesname_,classProbabilityOutputName,puVar5);
  return;
}

Assistant:

TreeEnsembleClassifier::TreeEnsembleClassifier
    (const std::string& predictedClassOutputName,
     const std::string& classProbabilityOutputName,
     const std::string& description)
    : TreeEnsembleBase(Model(description), true /* isClassifier */),
      tree_classifier_parameters(m_spec->mutable_treeensembleclassifier())
    {
        m_spec->mutable_description()->set_predictedfeaturename(predictedClassOutputName);
        m_spec->mutable_description()->set_predictedprobabilitiesname(classProbabilityOutputName);
    }